

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoCreateGateAdd(Nf_Man_t *pMan,word uTruth,int *pFans,int nFans,int CellId,
                        Vec_Wec_t *vProfs,Vec_Wrd_t *vStore)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *p;
  Jf_Par_t *pJVar7;
  ulong uVar8;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pCell;
  ulong uVar9;
  Vec_Int_t *local_68;
  word uFunc;
  
  pCell = pMan->pCells + CellId;
  uVar8 = (ulong)((uint)uTruth & 1);
  uFunc = -uVar8 ^ uTruth;
  iVar1 = Vec_MemHashInsert(pMan->vTtMem,&uFunc);
  p_00 = pMan->vTt2Match;
  if (iVar1 == p_00->nSize) {
    Vec_WecPushLevel(p_00);
    p_00 = pMan->vTt2Match;
  }
  p = Vec_WecEntry(p_00,iVar1);
  if (*(uint *)&pCell->field_0x10 >> 0x1c != nFans) {
    __assert_fail("nFans == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0xc6,
                  "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                 );
  }
  for (uVar9 = 0; uVar6 = (uint)uVar8, (uint)nFans != uVar9; uVar9 = uVar9 + 1) {
    iVar2 = Abc_Lit2Var(pFans[uVar9]);
    iVar3 = Abc_LitIsCompl(pFans[uVar9]);
    iVar4 = Abc_Lit2Var(pFans[uVar9]);
    uVar8 = (ulong)(uVar6 & 0xffffff01 | ((int)uVar9 << ((char)iVar2 * '\x04' & 0x1fU)) << 8 |
                   ((iVar3 << ((byte)iVar4 & 0x1f)) * 2 | uVar6) & 0xfe);
  }
  pJVar7 = pMan->pPars;
  if (pJVar7->fPinFilter == 0) {
    local_68 = (Vec_Int_t *)0x0;
  }
  else {
    iVar2 = pMan->vTt2Match->nSize;
    if (iVar2 != vProfs->nSize) {
      __assert_fail("Vec_WecSize(pMan->vTt2Match) == Vec_WecSize(vProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0xd0,
                    "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                   );
    }
    if (iVar1 == iVar2) {
      Vec_WecPushLevel(vProfs);
    }
    local_68 = Vec_WecEntry(vProfs,iVar1);
    iVar1 = p->nSize;
    if (iVar1 != local_68->nSize * 2) {
      __assert_fail("Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0xd4,
                    "void Nf_StoCreateGateAdd(Nf_Man_t *, word, int *, int, int, Vec_Wec_t *, Vec_Wrd_t *)"
                   );
    }
    iVar3 = 0;
    for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 2) {
      Vec_IntEntry(p,iVar2 + -1);
      iVar1 = Vec_IntEntry(p,iVar2);
      if ((char)uVar8 == (char)iVar1) {
        uVar5 = Vec_IntEntry(local_68,iVar3);
        if (((int)uVar5 < 0) || (vStore->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        iVar1 = Nf_StoCellIsDominated(pCell,pFans,vStore->pArray + uVar5);
        if (iVar1 != 0) {
          return;
        }
      }
      iVar1 = p->nSize;
      iVar3 = iVar3 + 1;
    }
    pJVar7 = pMan->pPars;
  }
  if (pJVar7->fPinPerm == 0) {
    if (pJVar7->fPinQuick == 0) {
      for (iVar1 = 1; iVar1 < p->nSize; iVar1 = iVar1 + 2) {
        iVar2 = Vec_IntEntry(p,iVar1 + -1);
        uVar5 = Vec_IntEntry(p,iVar1);
        if ((iVar2 == CellId) && (((uVar5 ^ uVar6) & 0xfe) == 0)) {
          return;
        }
      }
    }
    else {
      for (iVar1 = 1; iVar1 < p->nSize; iVar1 = iVar1 + 2) {
        iVar2 = Vec_IntEntry(p,iVar1 + -1);
        uVar5 = Vec_IntEntry(p,iVar1);
        if ((iVar2 == CellId) &&
           (*(int *)((long)Abc_TtBitCount8 + (ulong)(uVar5 & 0xfe) * 2) ==
            Abc_TtBitCount8[(uint)(uVar8 >> 1) & 0x7f])) {
          return;
        }
      }
    }
  }
  Vec_IntPush(p,CellId);
  Vec_IntPush(p,uVar6);
  if (pMan->pPars->fPinFilter != 0) {
    Vec_IntPush(local_68,vStore->nSize);
    Vec_WrdPush(vStore,pCell->Area);
    uVar9 = 0;
    uVar8 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      uVar6 = Abc_Lit2Var(pFans[uVar9]);
      Vec_WrdPush(vStore,pCell->Delays[uVar6]);
    }
  }
  return;
}

Assistant:

void Nf_StoCreateGateAdd( Nf_Man_t * pMan, word uTruth, int * pFans, int nFans, int CellId, Vec_Wec_t * vProfs, Vec_Wrd_t * vStore )
{
    Vec_Int_t * vArray, * vArrayProfs = NULL;
    Mio_Cell2_t * pCell = Nf_ManCell( pMan, CellId );
    int i, k, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( pMan->vTtMem, &uFunc );
    Nf_Cfg_t Mat = Nf_Int2Cfg(0);
    // get match array
    if ( iFunc == Vec_WecSize(pMan->vTt2Match) )
        Vec_WecPushLevel( pMan->vTt2Match );
    vArray = Vec_WecEntry( pMan->vTt2Match, iFunc );
    // create match
    Mat.fCompl = fCompl;
    assert( nFans == (int)pCell->nFanins );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(i << (Abc_Lit2Var(pFans[i]) << 2));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << Abc_Lit2Var(pFans[i]));
    }
    // check other profiles
    if ( pMan->pPars->fPinFilter )
    {
        // get profile array
        assert( Vec_WecSize(pMan->vTt2Match) == Vec_WecSize(vProfs) );
        if ( iFunc == Vec_WecSize(vProfs) )
            Vec_WecPushLevel( vProfs );
        vArrayProfs = Vec_WecEntry( vProfs, iFunc );
        assert( Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs) );
        // skip dominated matches
        Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
            if ( Nf_Int2Cfg(Entry).Phase == Mat.Phase && Nf_Int2Cfg(Entry).fCompl == Mat.fCompl )
            {
                int Offset = Vec_IntEntry(vArrayProfs, i/2);
                word * pProf = Vec_WrdEntryP(vStore, Offset);
                if ( Nf_StoCellIsDominated(pCell, pFans, pProf) )
                    return;
            }
    }
    // check pin permutation
    if ( !pMan->pPars->fPinPerm ) // do not use  pin-permutation (improves delay when pin-delays differ)
    {
        if ( pMan->pPars->fPinQuick ) // reduce the number of matches agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == CellId && Abc_TtBitCount8[Nf_Int2Cfg(Entry).Phase] == Abc_TtBitCount8[Mat.Phase] )
                    return;
        }
        else // reduce the number of matches less agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == CellId && Nf_Int2Cfg(Entry).Phase == Mat.Phase )
                    return;
        }
    }
    // save data and profile
    Vec_IntPush( vArray, CellId );
    Vec_IntPush( vArray, Nf_Cfg2Int(Mat) );
    // add delay profile
    if ( pMan->pPars->fPinFilter )
    {
        Vec_IntPush( vArrayProfs, Vec_WrdSize(vStore) );
        Vec_WrdPush( vStore, pCell->Area );
        for ( k = 0; k < nFans; k++ )
            Vec_WrdPush( vStore, pCell->Delays[Abc_Lit2Var(pFans[k])] );
    }
}